

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void activate_in_columns(ecs_world_t *world,ecs_query_t *query,ecs_map_t *component_map,
                        _Bool activate)

{
  long lVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *pvVar4;
  ecs_on_demand_in_t *peVar5;
  void *pvVar6;
  int iVar7;
  int local_4c;
  int32_t in_count;
  int32_t s;
  ecs_on_demand_out_t **out;
  ecs_on_demand_in_t *in;
  int32_t count;
  int32_t i;
  ecs_sig_column_t *columns;
  _Bool activate_local;
  ecs_map_t *component_map_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  pvVar4 = _ecs_vector_first((query->sig).columns,0x28,0x10);
  iVar2 = ecs_vector_count((query->sig).columns);
  in._4_4_ = 0;
  do {
    if (iVar2 <= in._4_4_) {
      return;
    }
    if (*(int *)((long)pvVar4 + (long)in._4_4_ * 0x28 + 8) == 1) {
      peVar5 = get_in_component(component_map,
                                *(ecs_entity_t *)((long)pvVar4 + (long)in._4_4_ * 0x28 + 0x10));
      _ecs_assert(peVar5 != (ecs_on_demand_in_t *)0x0,0xc,(char *)0x0,"in != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x32);
      if (peVar5 == (ecs_on_demand_in_t *)0x0) {
        __assert_fail("in != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x32,
                      "void activate_in_columns(ecs_world_t *, ecs_query_t *, ecs_map_t *, _Bool)");
      }
      iVar7 = -1;
      if (activate) {
        iVar7 = 1;
      }
      peVar5->count = iVar7 + peVar5->count;
      _ecs_assert(-1 < peVar5->count,0xc,(char *)0x0,"in->count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x36);
      if (peVar5->count < 0) {
        __assert_fail("in->count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x36,
                      "void activate_in_columns(ecs_world_t *, ecs_query_t *, ecs_map_t *, _Bool)");
      }
      if ((peVar5->systems != (ecs_vector_t *)0x0) &&
         (((activate && (peVar5->count == 1)) || ((!activate && (peVar5->count == 0)))))) {
        pvVar6 = _ecs_vector_first(peVar5->systems,8,0x10);
        iVar3 = ecs_vector_count(peVar5->systems);
        for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
          iVar7 = -1;
          if (activate) {
            iVar7 = 1;
          }
          lVar1 = *(long *)((long)pvVar6 + (long)local_4c * 8);
          *(int *)(lVar1 + 8) = iVar7 + *(int *)(lVar1 + 8);
          if ((activate) && (*(int *)(*(long *)((long)pvVar6 + (long)local_4c * 8) + 8) == 1)) {
            ecs_remove_entity(world,**(ecs_entity_t **)((long)pvVar6 + (long)local_4c * 8),0x104);
          }
          else if ((!activate) && (*(int *)(*(long *)((long)pvVar6 + (long)local_4c * 8) + 8) == 0))
          {
            ecs_add_entity(world,**(ecs_entity_t **)((long)pvVar6 + (long)local_4c * 8),0x104);
          }
        }
      }
    }
    in._4_4_ = in._4_4_ + 1;
  } while( true );
}

Assistant:

static
void activate_in_columns(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_map_t *component_map,
    bool activate)
{
    ecs_sig_column_t *columns = ecs_vector_first(query->sig.columns, ecs_sig_column_t);
    int32_t i, count = ecs_vector_count(query->sig.columns);

    for (i = 0; i < count; i ++) {
        if (columns[i].inout_kind == EcsIn) {
            ecs_on_demand_in_t *in = get_in_component(
                component_map, columns[i].is.component);
            ecs_assert(in != NULL, ECS_INTERNAL_ERROR, NULL);

            in->count += activate ? 1 : -1;

            ecs_assert(in->count >= 0, ECS_INTERNAL_ERROR, NULL);

            /* If this is the first system that registers the in component, walk
             * over all already registered systems to enable them */
            if (in->systems && 
               ((activate && in->count == 1) || 
                (!activate && !in->count))) 
            {
                ecs_on_demand_out_t **out = ecs_vector_first(
                    in->systems, ecs_on_demand_out_t*);
                int32_t s, in_count = ecs_vector_count(in->systems);

                for (s = 0; s < in_count; s ++) {
                    /* Increase the count of the system with the out params */
                    out[s]->count += activate ? 1 : -1;
                    
                    /* If this is the first out column that is requested from
                     * the OnDemand system, enable it */
                    if (activate && out[s]->count == 1) {
                        ecs_remove_entity(world, out[s]->system, EcsDisabledIntern);
                    } else if (!activate && !out[s]->count) {
                        ecs_add_entity(world, out[s]->system, EcsDisabledIntern);             
                    }
                }
            }
        }
    }    
}